

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  char *pcVar1;
  int iVar2;
  ImFont **ppIVar3;
  long lVar4;
  ImFontAtlasCustomRect *ptr;
  long lVar5;
  long lVar6;
  ImFontConfig *ptr_00;
  
  ptr_00 = (this->ConfigData).Data;
  lVar5 = (long)(this->ConfigData).Size;
  if (lVar5 != 0) {
    lVar6 = 0;
    do {
      if ((*(void **)(ptr_00->Name + lVar6 + -0x5a) != (void *)0x0) &&
         (ptr_00->Name[lVar6 + -0x4e] == '\x01')) {
        ImGui::MemFree(*(void **)(ptr_00->Name + lVar6 + -0x5a));
        pcVar1 = ptr_00->Name + lVar6 + -0x5a;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
      }
      lVar6 = lVar6 + 0x90;
    } while (lVar5 * 0x90 != lVar6);
    ptr_00 = (this->ConfigData).Data;
  }
  lVar5 = (long)(this->Fonts).Size;
  if (lVar5 != 0) {
    ppIVar3 = (this->Fonts).Data;
    iVar2 = (this->ConfigData).Size;
    lVar6 = 0;
    do {
      lVar4 = *(long *)((long)ppIVar3 + lVar6);
      if ((ptr_00 <= *(ImFontConfig **)(lVar4 + 0x48)) &&
         (*(ImFontConfig **)(lVar4 + 0x48) < ptr_00 + iVar2)) {
        *(undefined8 *)(lVar4 + 0x48) = 0;
        *(undefined2 *)(lVar4 + 0x50) = 0;
      }
      lVar6 = lVar6 + 8;
    } while (lVar5 * 8 != lVar6);
  }
  if (ptr_00 != (ImFontConfig *)0x0) {
    (this->ConfigData).Size = 0;
    (this->ConfigData).Capacity = 0;
    ImGui::MemFree(ptr_00);
    (this->ConfigData).Data = (ImFontConfig *)0x0;
  }
  ptr = (this->CustomRects).Data;
  if (ptr != (ImFontAtlasCustomRect *)0x0) {
    (this->CustomRects).Size = 0;
    (this->CustomRects).Capacity = 0;
    ImGui::MemFree(ptr);
    (this->CustomRects).Data = (ImFontAtlasCustomRect *)0x0;
  }
  this->PackIdMouseCursors = -1;
  this->PackIdLines = -1;
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (ImFontConfig& font_cfg : ConfigData)
        if (font_cfg.FontData && font_cfg.FontDataOwnedByAtlas)
        {
            IM_FREE(font_cfg.FontData);
            font_cfg.FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (ImFont* font : Fonts)
        if (font->ConfigData >= ConfigData.Data && font->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            font->ConfigData = NULL;
            font->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    PackIdMouseCursors = PackIdLines = -1;
    // Important: we leave TexReady untouched
}